

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QPartialOrdering QVariant::compare(QVariant *lhs,QVariant *rhs)

{
  bool bVar1;
  void *rhs_00;
  QMetaType in_RSI;
  QMetaType in_RDI;
  long in_FS_OFFSET;
  QMetaType t;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  QMetaTypeInterface *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  QMetaType *in_stack_ffffffffffffffb0;
  Private *in_stack_ffffffffffffffb8;
  QMetaType local_30;
  QMetaType local_28;
  QMetaTypeInterface *local_20;
  QMetaTypeInterface *local_18;
  CompareUnderlyingType local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (QMetaTypeInterface *)Private::type((Private *)in_stack_ffffffffffffffa0);
  local_20 = (QMetaTypeInterface *)Private::type((Private *)in_stack_ffffffffffffffa0);
  bVar1 = ::operator!=((QMetaType *)in_stack_ffffffffffffffa0,
                       (QMetaType *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  if (bVar1) {
    local_28 = Private::type(in_stack_ffffffffffffffa0);
    QMetaType::iface(&local_28);
    local_30 = Private::type(in_stack_ffffffffffffffa0);
    QMetaType::iface(&local_30);
    bVar1 = canBeNumericallyCompared
                      (in_stack_ffffffffffffffa0,
                       (QMetaTypeInterface *)
                       CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    if (bVar1) {
      local_9 = (CompareUnderlyingType)
                numericCompare((Private *)in_RSI.d_ptr,in_stack_ffffffffffffffb8);
    }
    else {
      metaType((QVariant *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      metaType((QVariant *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      bVar1 = qvCanConvertMetaObject(in_RDI,in_RSI);
      if (bVar1) {
        local_9 = (CompareUnderlyingType)
                  pointerCompare((Private *)in_stack_ffffffffffffffa0,
                                 (Private *)
                                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      }
      else {
        local_9 = -0x7f;
      }
    }
  }
  else {
    rhs_00 = constData((QVariant *)0x438952);
    constData((QVariant *)0x438961);
    local_9 = (CompareUnderlyingType)
              QMetaType::compare(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,rhs_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPartialOrdering)local_9;
  }
  __stack_chk_fail();
}

Assistant:

QPartialOrdering QVariant::compare(const QVariant &lhs, const QVariant &rhs)
{
    QMetaType t = lhs.d.type();
    if (t != rhs.d.type()) {
        // try numeric comparisons, with C++ type promotion rules (no conversion)
        if (canBeNumericallyCompared(lhs.d.type().iface(), rhs.d.type().iface()))
            return numericCompare(&lhs.d, &rhs.d);
        if (qvCanConvertMetaObject(lhs.metaType(), rhs.metaType()))
            return pointerCompare(&lhs.d, &rhs.d);
        return QPartialOrdering::Unordered;
    }
    return t.compare(lhs.constData(), rhs.constData());
}